

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

int __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::numThreads
          (DefaultThreadPoolProvider *this)

{
  Mutex *__mutex;
  pointer ppDVar1;
  pointer ppDVar2;
  int iVar3;
  
  __mutex = &(this->_data).threadMutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    ppDVar1 = (this->_data).threads.
              super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppDVar2 = (this->_data).threads.
              super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (int)((ulong)((long)ppDVar1 - (long)ppDVar2) >> 3);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

int
DefaultThreadPoolProvider::numThreads () const
{
    Lock lock (_data.threadMutex);
    return static_cast<int> (_data.threads.size());
}